

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestStreamingImpl::doStreamI(TestStreamingImpl *this,DoStreamIContext context)

{
  SourceLocation location;
  int iVar1;
  StreamingCallContext<capnproto_test::capnp::test::TestStreaming::DoStreamIParams> in_RDX;
  PromiseFulfillerPair<void> paf;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_68;
  PromiseBase in_stack_ffffffffffffffb8;
  CapTableReader *in_stack_ffffffffffffffc0;
  PromiseFulfiller<void> *pPStack_38;
  uint local_28;
  
  StreamingCallContext<capnproto_test::capnp::test::TestStreaming::DoStreamIParams>::getParams
            ((Reader *)&stack0xffffffffffffffb8,
             (StreamingCallContext<capnproto_test::capnp::test::TestStreaming::DoStreamIParams> *)
             &stack0xffffffffffffffb0);
  iVar1 = 0;
  if (0x1f < local_28) {
    iVar1 = *(int *)&(pPStack_38->super_PromiseRejector)._vptr_PromiseRejector;
  }
  *(int *)&context.hook[1]._vptr_CallContextHook =
       *(int *)&context.hook[1]._vptr_CallContextHook + iVar1;
  location.function = (char *)in_stack_ffffffffffffffb8.node.ptr;
  location.fileName = (char *)in_RDX.hook;
  location._16_8_ = in_stack_ffffffffffffffc0;
  kj::newPromiseAndFulfiller<void>(location);
  kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(context.hook + 2),&local_68);
  kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_68);
  (this->super_Server)._vptr_Server = (_func_int **)in_stack_ffffffffffffffb8.node.ptr;
  kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<void> *)&stack0xffffffffffffffb8);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> doStreamI(DoStreamIContext context) override {
    iSum += context.getParams().getI();
    auto paf = kj::newPromiseAndFulfiller<void>();
    fulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }